

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall maths::Matrix::gaussianEliminate(Matrix *this)

{
  uint uVar1;
  int iVar2;
  double **ppdVar3;
  double *pdVar4;
  bool bVar5;
  Matrix *in_RSI;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  Matrix MVar17;
  
  Matrix(this,in_RSI);
  uVar1 = this->rows_;
  iVar2 = this->cols_;
  MVar17.p._0_4_ = iVar2 + -1;
  ppdVar3 = this->p;
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  uVar8 = 1;
  iVar9 = 0;
  do {
    if (uVar6 == uVar7) {
      MVar17._0_8_ = this;
      MVar17.p._4_4_ = 0;
      return MVar17;
    }
    lVar10 = (long)iVar9;
LAB_0011ec6b:
    lVar10 = lVar10 + 1;
    bVar5 = false;
LAB_0011ec73:
    if ((iVar9 < (int)MVar17.p) && (!bVar5)) {
      dVar15 = ppdVar3[uVar6][iVar9];
      bVar5 = true;
      if ((dVar15 != 0.0) || (NAN(dVar15))) goto LAB_0011ec73;
      dVar15 = 0.0;
      uVar13 = uVar6 & 0xffffffff;
      for (uVar12 = uVar8; (int)uVar12 < (int)uVar1; uVar12 = uVar12 + 1) {
        dVar16 = ppdVar3[uVar12][iVar9];
        uVar14 = -(ulong)(dVar16 < -dVar16);
        dVar16 = (double)(~uVar14 & (ulong)dVar16 | (ulong)-dVar16 & uVar14);
        if (dVar15 < dVar16) {
          uVar13 = uVar12 & 0xffffffff;
          dVar15 = dVar16;
        }
      }
      if (uVar6 != uVar13) {
        pdVar4 = ppdVar3[(int)uVar13];
        ppdVar3[(int)uVar13] = ppdVar3[uVar6];
        ppdVar3[uVar6] = pdVar4;
        goto LAB_0011ec73;
      }
      iVar9 = iVar9 + 1;
      goto LAB_0011ec6b;
    }
    uVar13 = uVar6;
    if (bVar5) {
      while (uVar13 = uVar13 + 1, lVar11 = lVar10, (int)uVar13 < (int)uVar1) {
        for (; pdVar4 = ppdVar3[uVar13], lVar11 < iVar2; lVar11 = lVar11 + 1) {
          dVar15 = pdVar4[lVar11] - (pdVar4[iVar9] / ppdVar3[uVar6][iVar9]) * ppdVar3[uVar6][lVar11]
          ;
          pdVar4[lVar11] = (double)(~-(ulong)(ABS(dVar15) < 1e-10) & (ulong)dVar15);
        }
        pdVar4[iVar9] = 0.0;
      }
    }
    uVar6 = uVar6 + 1;
    iVar9 = iVar9 + 1;
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

Matrix Matrix::gaussianEliminate()
{
    Matrix Ab(*this);
    int rows = Ab.rows_;
    int cols = Ab.cols_;
    int Acols = cols - 1;

    int i = 0; // row tracker
    int j = 0; // column tracker

    // iterate through the rows
    while (i < rows)
    {
        // find a pivot for the row
        bool pivot_found = false;
        while (j < Acols && !pivot_found)
        {
            if (Ab(i, j) != 0) { // pivot not equal to 0
                pivot_found = true;
            } else { // check for a possible swap
                int max_row = i;
                double max_val = 0;
                for (int k = i + 1; k < rows; ++k)
                {
                    double cur_abs = Ab(k, j) >= 0 ? Ab(k, j) : -1 * Ab(k, j);
                    if (cur_abs > max_val)
                    {
                        max_row = k;
                        max_val = cur_abs;
                    }
                }
                if (max_row != i) {
                    Ab.swapRows(max_row, i);
                    pivot_found = true;
                } else {
                    j++;
                }
            }
        }

        // perform elimination as normal if pivot was found
        if (pivot_found)
        {
            for (int t = i + 1; t < rows; ++t) {
                for (int s = j + 1; s < cols; ++s) {
                    Ab(t, s) = Ab(t, s) - Ab(i, s) * (Ab(t, j) / Ab(i, j));
                    if (Ab(t, s) < EPS && Ab(t, s) > -1*EPS)
                        Ab(t, s) = 0;
                }
                Ab(t, j) = 0;
            }
        }

        i++;
        j++;
    }

    return Ab;
}